

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetMassFn(void *arkode_mem,ARKLsMassFn mass)

{
  ARKodeMem in_RSI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessMassMem(in_RSI,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if (in_RSI == (ARKodeMem)0x0) {
      arkProcessError(in_stack_ffffffffffffffe0,-3,"ARKLS","arkLSSetMassFn",
                      "Mass-matrix routine must be non-NULL");
      local_4 = -3;
    }
    else if (in_stack_ffffffffffffffd8[2] == (ARKodeMem)0x0) {
      arkProcessError(in_stack_ffffffffffffffe0,-3,"ARKLS","arkLSSetMassFn",
                      "Mass-matrix routine cannot be supplied for NULL SUNMatrix");
      local_4 = -3;
    }
    else {
      in_stack_ffffffffffffffd8[1] = in_RSI;
      in_stack_ffffffffffffffd8[4] = (ARKodeMem)in_stack_ffffffffffffffe0->user_data;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkLSSetMassFn(void *arkode_mem, ARKLsMassFn mass)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassFn",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* return with failure if mass cannot be used */
  if (mass == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassFn",
                    "Mass-matrix routine must be non-NULL");
    return(ARKLS_ILL_INPUT);
  }
  if (arkls_mem->M == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassFn",
                    "Mass-matrix routine cannot be supplied for NULL SUNMatrix");
    return(ARKLS_ILL_INPUT);
  }

  /* set mass matrix routine pointer and return */
  arkls_mem->mass   = mass;
  arkls_mem->M_data = ark_mem->user_data;

  return(ARKLS_SUCCESS);
}